

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_hash_join.cpp
# Opt level: O2

void __thiscall
duckdb::HashJoinOperatorState::HashJoinOperatorState
          (HashJoinOperatorState *this,ClientContext *context,HashJoinGlobalSinkState *sink)

{
  type ht_p;
  
  (this->super_CachingOperatorState).cached_chunk.
  super_unique_ptr<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super___uniq_ptr_impl<duckdb::DataChunk,_std::default_delete<duckdb::DataChunk>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::DataChunk_*,_std::default_delete<duckdb::DataChunk>_>.
  super__Head_base<0UL,_duckdb::DataChunk_*,_false>._M_head_impl = (DataChunk *)0x0;
  (this->super_CachingOperatorState).initialized = false;
  (this->super_CachingOperatorState).can_cache_chunk = false;
  (this->super_CachingOperatorState).super_OperatorState._vptr_OperatorState =
       (_func_int **)&PTR__HashJoinOperatorState_027bbd28;
  DataChunk::DataChunk(&this->lhs_join_keys);
  TupleDataChunkState::TupleDataChunkState(&this->join_key_state);
  DataChunk::DataChunk(&this->lhs_output);
  ExpressionExecutor::ExpressionExecutor(&this->probe_executor,context);
  ht_p = unique_ptr<duckdb::JoinHashTable,_std::default_delete<duckdb::JoinHashTable>,_true>::
         operator*(&sink->hash_table);
  JoinHashTable::ScanStructure::ScanStructure(&this->scan_structure,ht_p,&this->join_key_state);
  (this->perfect_hash_join_state).
  super_unique_ptr<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>._M_t.
  super___uniq_ptr_impl<duckdb::OperatorState,_std::default_delete<duckdb::OperatorState>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::OperatorState_*,_std::default_delete<duckdb::OperatorState>_>.
  super__Head_base<0UL,_duckdb::OperatorState_*,_false>._M_head_impl = (OperatorState *)0x0;
  (this->spill_state).local_partition.ptr = (PartitionedColumnData *)0x0;
  (this->spill_state).local_partition_append_state.ptr = (PartitionedColumnDataAppendState *)0x0;
  JoinHashTable::ProbeState::ProbeState(&this->probe_state);
  DataChunk::DataChunk(&this->spill_chunk);
  return;
}

Assistant:

explicit HashJoinOperatorState(ClientContext &context, HashJoinGlobalSinkState &sink)
	    : probe_executor(context), scan_structure(*sink.hash_table, join_key_state) {
	}